

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManCollectPoIds(Gia_Man_t *p)

{
  int Entry;
  Vec_Int_t *p_00;
  int i;
  
  p_00 = Vec_IntAlloc(p->vCos->nSize - p->nRegs);
  for (i = 0; i < p->vCos->nSize - p->nRegs; i = i + 1) {
    Entry = Vec_IntEntry(p->vCos,i);
    Vec_IntPush(p_00,Entry);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectPoIds( Gia_Man_t * p )
{
    Vec_Int_t * vStart;
    int Entry, i;
    vStart = Vec_IntAlloc( Gia_ManPoNum(p) );
    Vec_IntForEachEntryStop( p->vCos, Entry, i, Gia_ManPoNum(p) )
        Vec_IntPush( vStart, Entry );
    return vStart;
}